

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_import_key(psa_key_attributes_t *attributes,uint8_t *data,size_t data_length,
              psa_key_handle_t *handle)

{
  psa_status_t pVar1;
  psa_key_attributes_t *driver_00;
  psa_se_drv_table_entry_t **in_R8;
  psa_key_slot_t *slot;
  psa_se_drv_table_entry_t *driver;
  psa_key_slot_t *local_38;
  psa_key_slot_t *local_30;
  
  local_38 = (psa_key_slot_t *)0x0;
  local_30 = (psa_key_slot_t *)0x0;
  if (data_length == 0) {
    pVar1 = -0x87;
  }
  else {
    driver_00 = (psa_key_attributes_t *)handle;
    pVar1 = psa_start_key_creation
                      ((psa_key_creation_method_t)attributes,(psa_key_attributes_t *)handle,
                       (psa_key_handle_t *)&local_38,&local_30,in_R8);
    if ((((pVar1 == 0) &&
         (pVar1 = psa_import_key_into_slot(local_38,data,data_length),
         driver_00 = (psa_key_attributes_t *)data, pVar1 == 0)) &&
        (pVar1 = psa_validate_optional_attributes(local_38,attributes), driver_00 = attributes,
        pVar1 == 0)) &&
       (pVar1 = psa_finish_key_creation(local_38,(psa_se_drv_table_entry_t *)attributes),
       driver_00 = attributes, pVar1 == 0)) {
      return 0;
    }
    psa_fail_key_creation(local_38,(psa_se_drv_table_entry_t *)driver_00);
    *handle = 0;
  }
  return pVar1;
}

Assistant:

psa_status_t psa_import_key( const psa_key_attributes_t *attributes,
                             const uint8_t *data,
                             size_t data_length,
                             psa_key_handle_t *handle )
{
    psa_status_t status;
    psa_key_slot_t *slot = NULL;
    psa_se_drv_table_entry_t *driver = NULL;

    /* Reject zero-length symmetric keys (including raw data key objects).
     * This also rejects any key which might be encoded as an empty string,
     * which is never valid. */
    if( data_length == 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );

    status = psa_start_key_creation( PSA_KEY_CREATION_IMPORT, attributes,
                                     handle, &slot, &driver );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( driver != NULL )
    {
        const psa_drv_se_t *drv = psa_get_se_driver_methods( driver );
        /* The driver should set the number of key bits, however in
         * case it doesn't, we initialize bits to an invalid value. */
        size_t bits = PSA_MAX_KEY_BITS + 1;
        if( drv->key_management == NULL ||
            drv->key_management->p_import == NULL )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        status = drv->key_management->p_import(
            psa_get_se_driver_context( driver ),
            slot->data.se.slot_number, attributes, data, data_length,
            &bits );
        if( status != PSA_SUCCESS )
            goto exit;
        if( bits > PSA_MAX_KEY_BITS )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        slot->attr.bits = (psa_key_bits_t) bits;
    }
    else
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
    {
        status = psa_import_key_into_slot( slot, data, data_length );
        if( status != PSA_SUCCESS )
            goto exit;
    }
    status = psa_validate_optional_attributes( slot, attributes );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_finish_key_creation( slot, driver );
exit:
    if( status != PSA_SUCCESS )
    {
        psa_fail_key_creation( slot, driver );
        *handle = 0;
    }
    return( status );
}